

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat3 * dja::adjugate(mat3 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  mat3 *in_RDI;
  
  in_RDI->m[0].x = 1.0;
  in_RDI->m[0].y = 0.0;
  *(undefined8 *)&in_RDI->m[0].z = 0;
  in_RDI->m[1].y = 1.0;
  in_RDI->m[1].z = 0.0;
  in_RDI->m[2].x = 0.0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[2].z = 1.0;
  fVar1 = m->m[2].z;
  fVar2 = m->m[1].y;
  fVar3 = m->m[1].z;
  fVar4 = m->m[2].y;
  in_RDI->m[0].x = fVar2 * fVar1 - fVar4 * fVar3;
  fVar5 = m->m[0].y;
  fVar6 = m->m[0].z;
  in_RDI->m[0].y = fVar4 * fVar6 - fVar5 * fVar1;
  in_RDI->m[0].z = fVar5 * fVar3 - fVar2 * fVar6;
  fVar7 = m->m[1].x;
  fVar8 = m->m[2].x;
  in_RDI->m[1].x = fVar3 * fVar8 - fVar7 * fVar1;
  fVar9 = m->m[0].x;
  in_RDI->m[1].y = fVar1 * fVar9 - fVar8 * fVar6;
  in_RDI->m[1].z = fVar6 * fVar7 - fVar3 * fVar9;
  in_RDI->m[2].x = fVar7 * fVar4 - fVar8 * fVar2;
  in_RDI->m[2].y = fVar5 * fVar8 - fVar4 * fVar9;
  in_RDI->m[2].z = fVar9 * fVar2 - fVar7 * fVar5;
  return in_RDI;
}

Assistant:

mat3 adjugate(const mat3& m)
{
    mat3 a;

    M00(a) = M11(m) * M22(m) - M12(m) * M21(m);
    M01(a) =-M01(m) * M22(m) + M02(m) * M21(m);
    M02(a) = M01(m) * M12(m) - M02(m) * M11(m);

    M10(a) =-M10(m) * M22(m) + M12(m) * M20(m);
    M11(a) = M00(m) * M22(m) - M02(m) * M20(m);
    M12(a) =-M00(m) * M12(m) + M02(m) * M10(m);

    M20(a) = M10(m) * M21(m) - M11(m) * M20(m);
    M21(a) =-M00(m) * M21(m) + M01(m) * M20(m);
    M22(a) = M00(m) * M11(m) - M01(m) * M10(m);

    return a;
}